

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>::fastAccessDx
          (FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_> *this,
          int i)

{
  return (((this->left_->fadexpr_).right_)->dx_).ptr_to_data[i] *
         (this->left_->fadexpr_).left_.constant_ + (this->right_->dx_).ptr_to_data[i];
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}